

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O2

string * __thiscall
(anonymous_namespace)::getStringAttribute_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,xmlNodePtr type,char *att_name
          )

{
  char *pcVar1;
  MissingAttribute *this_00;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  pcVar1 = (char *)xmlGetProp(this,type);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_60);
    (*_xmlFree)(pcVar1);
    return __return_storage_ptr__;
  }
  this_00 = (MissingAttribute *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string((string *)&local_60,(char *)type,&local_61);
  std::__cxx11::string::string((string *)&local_40,"",&local_62);
  Parsing::MissingAttribute::MissingAttribute(this_00,&local_60,&local_40);
  __cxa_throw(this_00,&Parsing::MissingAttribute::typeinfo,
              Parsing::MissingAttribute::~MissingAttribute);
}

Assistant:

std::string getStringAttribute(xmlNodePtr type, const char* att_name)
    {
        xmlChar* att = xmlGetProp(type, reinterpret_cast<const xmlChar*>(att_name) );
        if (! att)
            throw Parsing::MissingAttribute(att_name, "");
        std::string ret( reinterpret_cast<const char*>(att));
        xmlFree(att);
        return ret;
    }